

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solbase.h
# Opt level: O0

SolBase<double> * __thiscall
soplex::SolBase<double>::operator=
          (SolBase<double> *this,
          SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *sol)

{
  SolBase<double> *in_RSI;
  SolBase<double> *in_RDI;
  double dVar1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_00000018;
  VectorBase<double> *in_stack_00000020;
  
  if (in_RDI != in_RSI) {
    in_RDI->field_0x98 =
         in_RDI->field_0x98 & 0xfe |
         *(byte *)&in_RSI[1]._primalRay.val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start & 1;
    VectorBase<double>::operator=(in_stack_00000020,in_stack_00000018);
    VectorBase<double>::operator=(in_stack_00000020,in_stack_00000018);
    dVar1 = boost::multiprecision::number::operator_cast_to_double
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)0x45776c);
    in_RDI->_objVal = dVar1;
    in_RDI->field_0x98 =
         in_RDI->field_0x98 & 0xfd |
         (*(byte *)&in_RSI[1]._primalRay.val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 1 & 1) << 1;
    if (((byte)in_RDI->field_0x98 >> 1 & 1) != 0) {
      VectorBase<double>::operator=(in_stack_00000020,in_stack_00000018);
    }
    in_RDI->field_0x98 =
         in_RDI->field_0x98 & 0xfb |
         (*(byte *)&in_RSI[1]._primalRay.val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2 & 1) << 2;
    VectorBase<double>::operator=(in_stack_00000020,in_stack_00000018);
    VectorBase<double>::operator=(in_stack_00000020,in_stack_00000018);
    in_RDI->field_0x98 =
         in_RDI->field_0x98 & 0xf7 |
         (*(byte *)&in_RSI[1]._primalRay.val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3 & 1) << 3;
    if (((byte)in_RDI->field_0x98 >> 3 & 1) != 0) {
      VectorBase<double>::operator=(in_stack_00000020,in_stack_00000018);
    }
  }
  return in_RDI;
}

Assistant:

SolBase<R>& operator=(const SolBase<S>& sol)
   {
      if((SolBase<S>*)this != &sol)
      {

         _isPrimalFeasible = sol._isPrimalFeasible;
         _primal = sol._primal;
         _slacks = sol._slacks;

         _objVal = R(sol._objVal);

         _hasPrimalRay = sol._hasPrimalRay;

         if(_hasPrimalRay)
            _primalRay = sol._primalRay;

         _isDualFeasible = sol._isDualFeasible;
         _dual = sol._dual;
         _redCost = sol._redCost;

         _hasDualFarkas = sol._hasDualFarkas;

         if(_hasDualFarkas)
            _dualFarkas = sol._dualFarkas;
      }

      return *this;
   }